

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWMesh.cpp
# Opt level: O2

size_t __thiscall COLLADAFW::Mesh::getNormalsCount(Mesh *this)

{
  MeshPrimitive *pMVar1;
  size_t sVar2;
  size_t i;
  size_t sVar3;
  size_t groupedVtxIndex;
  long lVar4;
  
  sVar2 = 0;
  for (sVar3 = 0; sVar3 != (this->mMeshPrimitives).mCount; sVar3 = sVar3 + 1) {
    pMVar1 = (this->mMeshPrimitives).mData[sVar3];
    if (pMVar1->mPrimitiveType - TRIANGLE_FANS < 2) {
      for (lVar4 = 0;
          *(long *)&pMVar1[1].super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)520>.mUniqueId
          != lVar4; lVar4 = lVar4 + 1) {
        sVar2 = (sVar2 + (ulong)*(uint *)((long)pMVar1[1].
                                                super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)520>
                                                .super_Object._vptr_Object + lVar4 * 4) * 3) - 6;
      }
    }
    else {
      sVar2 = sVar2 + (pMVar1->mNormalIndices).mCount;
    }
  }
  return sVar2;
}

Assistant:

const size_t Mesh::getNormalsCount() const
    {
        // The number of normals in the current mesh.
        size_t numNormals = 0;

        // We have to go through every mesh primitive.
        const MeshPrimitiveArray& meshPrimitives = this->getMeshPrimitives ();
        size_t count = meshPrimitives.getCount ();
        for ( size_t i=0; i<count; ++i )
        {
            // Get the current primitive element.
            const MeshPrimitive* meshPrimitive = meshPrimitives [ i ];

            // Get the normal indices of the current primitive.
            const UIntValuesArray& normalIndices = meshPrimitive->getNormalIndices ();

            switch ( meshPrimitive->getPrimitiveType () )
            {
            case COLLADAFW::MeshPrimitive::TRIANGLE_FANS:
            case COLLADAFW::MeshPrimitive::TRIANGLE_STRIPS:
                {
                    COLLADAFW::MeshPrimitiveWithFaceVertexCount<unsigned int>* trifans = (COLLADAFW::MeshPrimitiveWithFaceVertexCount<unsigned int>*) meshPrimitive;
                    COLLADAFW::MeshPrimitiveWithFaceVertexCount<unsigned int>::VertexCountArray& vertexCountArray = trifans->getGroupedVerticesVertexCountArray ();
                    size_t groupedVtxCount = vertexCountArray.getCount ();
                    for ( size_t groupedVtxIndex=0; groupedVtxIndex<groupedVtxCount; ++groupedVtxIndex )
                    {
                        // Iterate over the indices and write their normal values into the maya file.
                        size_t indexCount = vertexCountArray[groupedVtxIndex]; //normalIndices.getCount();
                        numNormals += (indexCount - 2) * 3;
                    }
                }
                break;
            default:
                {
                    // Add the normals to the sum of normals
                    numNormals += normalIndices.getCount ();
                }
            }
        }

        return numNormals;
    }